

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool flatbuffers::DeserializeAttributesCommon
               (SymbolTable<flatbuffers::Value> *attributes,Parser *parser,
               Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs)

{
  bool bVar1;
  return_type this;
  Value *this_00;
  String *pSVar2;
  uint i;
  string local_50;
  
  if (attrs != (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0) {
    for (i = 0; i < *(uint *)attrs; i = i + 1) {
      this = Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>::Get(attrs,i);
      this_00 = (Value *)operator_new(0x48);
      Value::Value(this_00);
      pSVar2 = reflection::KeyValue::value(this);
      if (pSVar2 != (String *)0x0) {
        pSVar2 = reflection::KeyValue::value(this);
        String::str_abi_cxx11_(&local_50,pSVar2);
        std::__cxx11::string::operator=((string *)&this_00->constant,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      pSVar2 = reflection::KeyValue::key(this);
      String::str_abi_cxx11_(&local_50,pSVar2);
      bVar1 = SymbolTable<flatbuffers::Value>::Add(attributes,&local_50,this_00);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        std::__cxx11::string::~string((string *)&this_00->constant);
        operator_delete(this_00,0x48);
        return false;
      }
      pSVar2 = reflection::KeyValue::key(this);
      String::str_abi_cxx11_(&local_50,pSVar2);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::operator[](&parser->known_attributes_,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return true;
}

Assistant:

static bool DeserializeAttributesCommon(
    SymbolTable<Value> &attributes, Parser &parser,
    const Vector<Offset<reflection::KeyValue>> *attrs) {
  if (attrs == nullptr) return true;
  for (uoffset_t i = 0; i < attrs->size(); ++i) {
    auto kv = attrs->Get(i);
    auto value = new Value();
    if (kv->value()) { value->constant = kv->value()->str(); }
    if (attributes.Add(kv->key()->str(), value)) {
      delete value;
      return false;
    }
    parser.known_attributes_[kv->key()->str()];
  }
  return true;
}